

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::LICMPass::AnalyseAndHoistFromBB
          (LICMPass *this,Loop *loop,Function *f,BasicBlock *bb,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *loop_bbs)

{
  pointer *pppBVar1;
  BasicBlock **__args;
  iterator __position;
  BasicBlock *pBVar2;
  Loop *pLVar3;
  bool bVar4;
  char cVar5;
  _Rb_tree_color _Var6;
  uint32_t uVar7;
  DominatorAnalysis *pDVar8;
  const_iterator cVar9;
  Instruction *pIVar10;
  _Base_ptr p_Var11;
  _Base_ptr *pp_Var12;
  Instruction *pIVar13;
  Status SVar14;
  _Base_ptr p_Var15;
  bool modified;
  byte local_79;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  LICMPass *local_50;
  Function *local_48;
  BasicBlock *local_40;
  Loop *local_38;
  
  local_79 = 0;
  local_70._8_8_ = 0;
  local_40 = bb;
  local_38 = loop;
  local_70._M_unused._M_object = operator_new(0x18);
  pBVar2 = local_40;
  *(LICMPass **)local_70._M_unused._0_8_ = this;
  *(Loop ***)((long)local_70._M_unused._0_8_ + 8) = &local_38;
  *(byte **)((long)local_70._M_unused._0_8_ + 0x10) = &local_79;
  local_58 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/licm_pass.cpp:86:7)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/licm_pass.cpp:86:7)>
             ::_M_manager;
  local_50 = this;
  local_48 = f;
  bVar4 = IsImmediatelyContainedInLoop(this,loop,f,local_40);
  if (bVar4) {
    pIVar10 = (pBVar2->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar10 != (Instruction *)0x0) {
      local_78._M_head_impl = pIVar10;
      bVar4 = std::
              _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/licm_pass.cpp:86:7)>
              ::_M_invoke(&local_70,&local_78._M_head_impl);
      SVar14 = Failure;
      if (!bVar4) goto LAB_002392c8;
    }
    pIVar10 = (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar10 != (Instruction *)0x0) &&
       ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      do {
        if (pIVar10 == (Instruction *)0x0) goto LAB_002391f1;
        pIVar13 = (pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        local_78._M_head_impl = pIVar10;
        if (local_60 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        SVar14 = Failure;
        if ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar13 = (Instruction *)0x0;
        }
        cVar5 = (*local_58)(&local_70,&local_78);
        pIVar10 = pIVar13;
      } while (cVar5 != '\0');
      goto LAB_002392c8;
    }
  }
LAB_002391f1:
  pDVar8 = IRContext::GetDominatorAnalysis((local_50->super_Pass).context_,local_48);
  pIVar10 = (pBVar2->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  _Var6 = _S_red;
  if (pIVar10->has_result_id_ == true) {
    _Var6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  p_Var11 = *(_Base_ptr *)
             ((long)&(pDVar8->super_DominatorAnalysisBase).tree_.nodes_._M_t._M_impl.
                     super__Rb_tree_header._M_header + 8);
  p_Var15 = &(pDVar8->super_DominatorAnalysisBase).tree_.nodes_._M_t._M_impl.super__Rb_tree_header.
             _M_header;
  do {
    bVar4 = p_Var11[1]._M_color < _Var6;
    if (!bVar4) {
      p_Var15 = p_Var11;
    }
    p_Var11 = (&p_Var11->_M_left)[bVar4];
  } while (p_Var11 != (_Base_ptr)0x0);
  pp_Var12 = (_Base_ptr *)0x0;
  if (p_Var15[1]._M_color <= _Var6) {
    pp_Var12 = &p_Var15[1]._M_parent;
  }
  p_Var11 = pp_Var12[2];
  p_Var15 = pp_Var12[3];
  if (p_Var11 != p_Var15) {
    do {
      pLVar3 = local_38;
      __args = *(BasicBlock ***)p_Var11;
      pIVar10 = ((*__args)->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar7 = 0;
      if (pIVar10->has_result_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
      }
      local_78._M_head_impl._0_4_ = uVar7;
      cVar9 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(pLVar3->loop_basic_blocks_)._M_h,(key_type_conflict *)&local_78);
      if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        __position._M_current =
             (loop_bbs->
             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (loop_bbs->
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
          _M_realloc_insert<spvtools::opt::BasicBlock*const&>
                    ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>
                      *)loop_bbs,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          pppBVar1 = &(loop_bbs->
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
      }
      p_Var11 = (_Base_ptr)&p_Var11->_M_parent;
    } while (p_Var11 != p_Var15);
  }
  SVar14 = local_79 ^ SuccessWithoutChange;
LAB_002392c8:
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,3);
  }
  return SVar14;
}

Assistant:

Pass::Status LICMPass::AnalyseAndHoistFromBB(
    Loop* loop, Function* f, BasicBlock* bb,
    std::vector<BasicBlock*>* loop_bbs) {
  bool modified = false;
  std::function<bool(Instruction*)> hoist_inst =
      [this, &loop, &modified](Instruction* inst) {
        if (loop->ShouldHoistInstruction(*inst)) {
          if (!HoistInstruction(loop, inst)) {
            return false;
          }
          modified = true;
        }
        return true;
      };

  if (IsImmediatelyContainedInLoop(loop, f, bb)) {
    if (!bb->WhileEachInst(hoist_inst, false)) {
      return Status::Failure;
    }
  }

  DominatorAnalysis* dom_analysis = context()->GetDominatorAnalysis(f);
  DominatorTree& dom_tree = dom_analysis->GetDomTree();

  for (DominatorTreeNode* child_dom_tree_node : *dom_tree.GetTreeNode(bb)) {
    if (loop->IsInsideLoop(child_dom_tree_node->bb_)) {
      loop_bbs->push_back(child_dom_tree_node->bb_);
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}